

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionChecker.cpp
# Opt level: O3

void __thiscall RegionChecker::RegionChecker(RegionChecker *this,istream *file)

{
  _Bvector_impl *p_Var1;
  int iVar2;
  uint uVar3;
  byte *pbVar4;
  byte *pbVar5;
  long *plVar6;
  allocator_type local_4a;
  bool local_49;
  vector<bool,_std::allocator<bool>_> local_48;
  
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  std::istream::seekg((long)file,_S_beg);
  plVar6 = *(long **)(file + *(long *)(*(long *)file + -0x18) + 0xe8);
  if (plVar6 != (long *)0x0) {
LAB_0010c935:
    pbVar4 = (byte *)plVar6[2];
    pbVar5 = (byte *)plVar6[3];
    if (pbVar5 <= pbVar4) {
      iVar2 = (**(code **)(*plVar6 + 0x48))(plVar6);
      if (iVar2 == -1) goto LAB_0010c9ac;
      pbVar4 = (byte *)plVar6[2];
      pbVar5 = (byte *)plVar6[3];
    }
    if (pbVar4 < pbVar5) {
      uVar3 = (uint)*pbVar4;
    }
    else {
      uVar3 = (**(code **)(*plVar6 + 0x48))(plVar6);
      if (uVar3 == 0xffffffff) {
        plVar6 = (long *)0x0;
      }
    }
    std::vector<bool,_std::allocator<bool>_>::push_back(&this->fileUsage,(char)uVar3 != '\0');
    if ((ulong)plVar6[2] < (ulong)plVar6[3]) {
      plVar6[2] = plVar6[2] + 1;
    }
    else {
      (**(code **)(*plVar6 + 0x50))(plVar6);
    }
    goto LAB_0010c935;
  }
LAB_0010c9ac:
  std::istream::seekg((long)file,_S_beg);
  local_49 = false;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_48,
             (ulong)(this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
             ((long)(this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
             (long)(this->fileUsage).super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8,&local_49,
             &local_4a);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            ((_Bvector_base<std::allocator<bool>_> *)this);
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_p;
  p_Var1 = &(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var1->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var1->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base.field_0xc =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._12_4_;
  (this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p;
  p_Var1 = &(this->usedBits).super__Bvector_base<std::allocator<bool>_>._M_impl;
  (p_Var1->super__Bvector_impl_data)._M_start.super__Bit_iterator_base._M_offset =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_offset;
  *(undefined4 *)&(p_Var1->super__Bvector_impl_data)._M_start.super__Bit_iterator_base.field_0xc =
       local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._12_4_;
  return;
}

Assistant:

RegionChecker::RegionChecker(std::istream &file) {
	file.seekg(0, file.beg);
	std::istreambuf_iterator<char> iter(file);
	while (iter != std::istreambuf_iterator<char>()) {
		fileUsage.push_back(*iter != 0);
		iter++;
	}
	file.seekg(0, file.beg);
	usedBits = std::vector<bool>(fileUsage.size());
}